

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_distefano_1999.h
# Opt level: O3

void __thiscall DiStefano::FirstScan(DiStefano *this)

{
  long lVar1;
  int iVar2;
  Mat1b *pMVar3;
  long lVar4;
  long lVar5;
  Mat1i *pMVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  bool *pbVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  ulong uVar19;
  int iVar20;
  int *piVar21;
  long lVar22;
  long lVar23;
  
  this->i_new_label = 0;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar11 = *(int *)&pMVar3->field_0x8;
  if (0 < iVar11) {
    lVar4 = *(long *)&pMVar3->field_0x10;
    lVar5 = **(long **)&pMVar3->field_0x48;
    pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar7 = *(long *)&pMVar6->field_0x10;
    lVar8 = **(long **)&pMVar6->field_0x48;
    uVar19 = (ulong)*(uint *)&pMVar3->field_0xc;
    lVar22 = 0;
    do {
      if (0 < (int)uVar19) {
        lVar16 = lVar8 * lVar22 + lVar7;
        lVar1 = lVar16 - lVar8;
        piVar9 = this->a_class;
        pbVar10 = this->a_single;
        lVar23 = 0;
        do {
          if (*(char *)(lVar5 * lVar22 + lVar4 + lVar23) == '\0') {
            uVar17 = 0;
          }
          else {
            uVar17 = 0;
            uVar13 = 0;
            uVar15 = 0;
            uVar12 = 0;
            if (lVar22 != 0) {
              uVar12 = 0;
              if (lVar23 != 0) {
                uVar13 = *(uint *)(lVar1 + -4 + lVar23 * 4);
              }
              uVar15 = *(uint *)(lVar1 + lVar23 * 4);
              if (lVar23 < (int)uVar19 + -1) {
                uVar12 = *(uint *)(lVar1 + 4 + lVar23 * 4);
              }
            }
            if (lVar23 != 0) {
              uVar17 = (ulong)*(uint *)(lVar16 + -4 + lVar23 * 4);
            }
            if ((((uVar13 == 0) && (uVar15 == 0)) && (uVar12 == 0)) && ((int)uVar17 == 0)) {
              iVar11 = this->i_new_label;
              lVar14 = (long)iVar11 + 1;
              uVar13 = (uint)lVar14;
              this->i_new_label = uVar13;
              piVar9[(long)iVar11 + 1] = uVar13;
              bVar18 = true;
LAB_0018e229:
              pbVar10[lVar14] = bVar18;
            }
            else {
              if (uVar13 != 0) {
                uVar15 = uVar13;
              }
              uVar19 = (ulong)uVar15;
              if ((int)uVar15 < 1) {
                uVar19 = (ulong)uVar12;
                uVar15 = uVar12;
LAB_0018e263:
                if ((int)uVar15 < 1) goto LAB_0018e2be;
              }
              else if (0 < (int)uVar12) {
                iVar11 = piVar9[uVar19];
                iVar2 = piVar9[uVar12];
                if (iVar11 != iVar2) {
                  piVar21 = piVar9 + uVar19;
                  if (pbVar10[iVar11] == true) {
                    *piVar21 = iVar2;
                    piVar21 = piVar9 + uVar12;
                  }
                  else {
                    if (pbVar10[iVar2] == false) {
                      iVar20 = this->i_new_label;
                      if (0 < iVar20) {
                        lVar14 = 0;
                        do {
                          if (piVar9[lVar14 + 1] == iVar2) {
                            piVar9[lVar14 + 1] = iVar11;
                            iVar20 = this->i_new_label;
                          }
                          lVar14 = lVar14 + 1;
                        } while (lVar14 < iVar20);
                        goto LAB_0018e263;
                      }
                      goto LAB_0018e2a6;
                    }
                    piVar9[uVar12] = iVar11;
                  }
                  pbVar10[*piVar21] = false;
                }
              }
LAB_0018e2a6:
              uVar13 = (uint)uVar19;
              if (0 < (int)uVar17) {
                iVar11 = piVar9[uVar19];
                iVar2 = piVar9[uVar17];
                if (iVar11 != iVar2) {
                  if (pbVar10[iVar11] == true) {
                    piVar9[uVar19] = iVar2;
                    iVar11 = piVar9[uVar17];
                  }
                  else {
                    if (pbVar10[iVar2] == false) {
                      iVar20 = this->i_new_label;
                      if (0 < iVar20) {
                        lVar14 = 0;
                        do {
                          if (piVar9[lVar14 + 1] == iVar2) {
                            piVar9[lVar14 + 1] = iVar11;
                            iVar20 = this->i_new_label;
                          }
                          lVar14 = lVar14 + 1;
                          uVar17 = uVar19;
                        } while (lVar14 < iVar20);
                        goto LAB_0018e2be;
                      }
                      goto LAB_0018e2bc;
                    }
                    piVar9[uVar17] = iVar11;
                    iVar11 = piVar9[uVar19];
                  }
                  lVar14 = (long)iVar11;
                  bVar18 = false;
                  goto LAB_0018e229;
                }
              }
            }
LAB_0018e2bc:
            uVar17 = (ulong)uVar13;
          }
LAB_0018e2be:
          *(int *)(lVar16 + lVar23 * 4) = (int)uVar17;
          lVar23 = lVar23 + 1;
          uVar19 = (ulong)*(int *)&pMVar3->field_0xc;
        } while (lVar23 < (long)uVar19);
        iVar11 = *(int *)&pMVar3->field_0x8;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < iVar11);
  }
  return;
}

Assistant:

void FirstScan()
    {
        i_new_label = 0;

        for (int y = 0; y < img_.rows; y++) {

            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int x = 0; x < img_.cols; x++) {
                if (img_row[x]) {

                    int lp(0), lq(0), lr(0), ls(0), lx(0); // lMin(INT_MAX);
                    if (y > 0) {
                        if (x > 0)
                            lp = img_labels_row_prev[x - 1];
                        lq = img_labels_row_prev[x];
                        if (x < img_.cols - 1)
                            lr = img_labels_row_prev[x + 1];
                    }
                    if (x > 0)
                        ls = img_labels_row[x - 1];

                    // If everything around is background
                    if (lp == 0 && lq == 0 && lr == 0 && ls == 0) {
                        lx = ++i_new_label;
                        a_class[lx] = lx;
                        a_single[lx] = true;
                    }
                    else {
                        // p
                        lx = lp;
                        // q
                        if (lx == 0)
                            lx = lq;
                        // r
                        if (lx > 0) {
                            if (lr > 0 && a_class[lx] != a_class[lr]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[lr];
                                    a_single[a_class[lr]] = false;
                                }
                                else if (a_single[a_class[lr]]) {
                                    a_class[lr] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[lr];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = lr;
                        // s
                        if (lx > 0) {
                            if (ls > 0 && a_class[lx] != a_class[ls]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[ls];
                                    a_single[a_class[ls]] = false;
                                }
                                else if (a_single[a_class[ls]]) {
                                    a_class[ls] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[ls];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = ls;
                    }

                    img_labels_row[x] = lx;
                }
                else
                    img_labels_row[x] = 0;
            }
        }
    }